

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O2

void __thiscall jaegertracing::ThriftVisitor::setString(ThriftVisitor *this,string_view value)

{
  Tag *this_00;
  string sStack_48;
  string_view local_28;
  
  local_28.length_ = value.length_;
  local_28.data_ = value.data_;
  thrift::Tag::__set_vType(this->_tag,STRING);
  this_00 = this->_tag;
  opentracing::v3::string_view::operator_cast_to_string(&sStack_48,&local_28);
  thrift::Tag::__set_vStr(this_00,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void setString(opentracing::string_view value) const
    {
        _tag.__set_vType(thrift::TagType::STRING);
        _tag.__set_vStr(value);
    }